

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::StructType::~StructType(StructType *this)

{
  StructType *this_local;
  
  ~StructType(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Struct;
  }